

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O0

Tile * __thiscall Tile::flipY(Tile *this)

{
  Tile *this_00;
  int local_2c;
  int local_28;
  int y;
  int x;
  Tile *flipped_tile;
  Tile *this_local;
  
  this_00 = (Tile *)operator_new(0x50);
  Tile(this_00,this->id,(bool)(this->flipped_x & 1),true,(bool)(this->is_duplicate & 1),
       this->original_tile);
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      this_00->data[local_2c * 8 + local_28] = this->data[(7 - local_2c) * 8 + local_28];
    }
  }
  return this_00;
}

Assistant:

Tile *Tile::flipY() {
    Tile *flipped_tile = new Tile(id, flipped_x, true, is_duplicate, original_tile);

    for (int x = 0; x < TILE_WIDTH; x++) {
        for (int y = 0; y < TILE_HEIGHT; y++) {
            flipped_tile->data[y * TILE_WIDTH + x] = data[(TILE_HEIGHT - 1 - y) * TILE_WIDTH + x];
        }
    }

    return flipped_tile;
}